

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

iterator __thiscall
QHash<void_const_volatile*,void_const*>::emplace_helper<void_const*const&>
          (QHash<const_volatile_void_*,_const_void_*> *this,void **key,void **args)

{
  long lVar1;
  piter it;
  piter pVar2;
  Node<const_volatile_void_*,_const_void_*> *n;
  iterator<QHashPrivate::Node<const_volatile_void_*,_const_void_*>_> *in_RDX;
  Data<QHashPrivate::Node<const_volatile_void_*,_const_void_*>_> *in_RSI;
  long in_FS_OFFSET;
  InsertionResult result;
  iterator *in_stack_ffffffffffffff88;
  Data<QHashPrivate::Node<const_volatile_void_*,_const_void_*>_> *in_stack_ffffffffffffff90;
  size_t in_stack_ffffffffffffff98;
  undefined8 local_30;
  undefined8 local_28;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QHashPrivate::Data<QHashPrivate::Node<void_const_volatile*,void_const*>>::
  findOrInsert<void_const_volatile*>(in_RSI,&in_RDX->d);
  n = QHashPrivate::iterator<QHashPrivate::Node<const_volatile_void_*,_const_void_*>_>::node(in_RDX)
  ;
  QHashPrivate::Node<void_const_volatile*,void_const*>::createInPlace<void_const*const&>
            (n,(void **)in_RSI,&in_RDX->d);
  it.bucket = in_stack_ffffffffffffff98;
  it.d = in_stack_ffffffffffffff90;
  QHash<const_volatile_void_*,_const_void_*>::iterator::iterator(in_stack_ffffffffffffff88,it);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  pVar2.bucket = local_28;
  pVar2.d = local_30;
  return (iterator)pVar2;
}

Assistant:

iterator emplace_helper(Key &&key, Args &&... args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->emplaceValue(std::forward<Args>(args)...);
        return iterator(result.it);
    }